

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmsys::SystemTools::SplitString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *p,char sep,bool isPath)

{
  ulong uVar1;
  char *pcVar2;
  value_type local_c0;
  value_type local_a0;
  long local_80;
  size_type pos2;
  size_type pos1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60 [3];
  undefined4 local_48;
  undefined1 local_41;
  string local_40 [8];
  string path;
  bool isPath_local;
  char sep_local;
  string *p_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  
  path.field_2._M_local_buf[0xe] = isPath;
  path.field_2._M_local_buf[0xf] = sep;
  std::__cxx11::string::string(local_40,(string *)p);
  local_41 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    if (((path.field_2._M_local_buf[0xe] & 1U) != 0) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar2 == '/')) {
      local_68._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)local_60,&local_68);
      pos1 = std::__cxx11::string::erase(local_40,local_60[0]);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(char (*) [2])0x10b3d11);
    }
    pos2 = 0;
    local_80 = std::__cxx11::string::find
                         ((char)local_40,(ulong)(uint)(int)path.field_2._M_local_buf[0xf]);
    while (local_80 != -1) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      pos2 = local_80 + 1;
      local_80 = std::__cxx11::string::find
                           ((char)local_40,(ulong)(uint)(int)path.field_2._M_local_buf[0xf]);
    }
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  local_41 = 1;
  local_48 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> SystemTools::SplitString(const std::string& p,
                                                  char sep, bool isPath)
{
  std::string path = p;
  std::vector<std::string> paths;
  if (path.empty()) {
    return paths;
  }
  if (isPath && path[0] == '/') {
    path.erase(path.begin());
    paths.emplace_back("/");
  }
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = path.find(sep, pos1);
  while (pos2 != std::string::npos) {
    paths.push_back(path.substr(pos1, pos2 - pos1));
    pos1 = pos2 + 1;
    pos2 = path.find(sep, pos1 + 1);
  }
  paths.push_back(path.substr(pos1, pos2 - pos1));

  return paths;
}